

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextWindow(bool also_over_items,char *str_id,int mouse_button)

{
  bool bVar1;
  char *str_id_00;
  
  str_id_00 = "window_context_menu";
  if (str_id != (char *)0x0) {
    str_id_00 = str_id;
  }
  if (GImGui->HoveredWindow == GImGui->CurrentWindow) {
    bVar1 = IsMouseClicked(mouse_button,false);
    if ((bVar1) &&
       ((also_over_items || ((GImGui->HoveredId == 0 && (GImGui->HoveredIdPreviousFrame == 0)))))) {
      OpenPopupEx(str_id_00,true);
    }
  }
  bVar1 = BeginPopup(str_id_00);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextWindow(bool also_over_items, const char* str_id, int mouse_button)
{
    if (!str_id) str_id = "window_context_menu";
    if (IsMouseHoveringWindow() && IsMouseClicked(mouse_button))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(str_id, true);
    return BeginPopup(str_id);
}